

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O2

void __thiscall hash_data::decode(hash_data *this,U64 *dkey)

{
  ulong uVar1;
  
  uVar1 = *dkey;
  this->bound = (byte)(uVar1 >> 0x1a) & 3;
  this->depth = (byte)(uVar1 >> 0x1e) & 0x3f;
  this->score = (ushort)(uint)(uVar1 >> 0x26) & 0x3fff;
  this->age = (U8)uVar1;
  (this->move).f = (U8)uVar1;
  (this->move).t = (U8)(uVar1 >> 8);
  (this->move).type = (U8)(uVar1 >> 0x10);
  return;
}

Assistant:

inline void decode(const U64& dkey) {

		U8 f = U8(dkey & 0xFF);
		U8 t = U8((dkey & 0xFF00) >> 8);
		Movetype type = Movetype((dkey & 0xFF0000) >> 16);
		bound = U8((dkey & 0xF000000) >> 26);
		depth = U8((dkey & 0xFF0000000) >> 30);
		score = int16((dkey & 0xFFFF000000000) >> 38);
		int sign = int(dkey & (1ULL << 54));
		score = (sign == 1 ? -score : score);
		age = U8(dkey & 0x7F80000000000000 >> 55);

		move.set(f, t, type);
	}